

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

void __thiscall SQVM::FindOuter(SQVM *this,SQObjectPtr *target,SQObjectPtr *stackindex)

{
  SQUnsignedInteger *pSVar1;
  SQObjectValue SVar2;
  SQTable *pSVar3;
  SQOuter *x;
  SQOuter **ppSVar4;
  SQObjectPtr local_30;
  
  ppSVar4 = &this->_openouters;
  while ((SVar2.pOuter = *ppSVar4, (SQOuter *)SVar2.pTable != (SQOuter *)0x0 &&
         (pSVar3 = ((SVar2.pTable)->super_SQDelegable)._delegate, stackindex <= pSVar3))) {
    if (pSVar3 == (SQTable *)stackindex) {
      local_30.super_SQObject._type = OT_OUTER;
      pSVar1 = &((SVar2.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      local_30.super_SQObject._unVal.pOuter = SVar2.pOuter;
      SQObjectPtr::operator=(target,&local_30);
      goto LAB_00127b89;
    }
    ppSVar4 = &(SVar2.pOuter)->_next;
  }
  x = SQOuter::Create(this->_sharedstate,stackindex);
  x->_next = *ppSVar4;
  x->_idx = (long)stackindex - (long)(this->_stack)._vals >> 4;
  pSVar1 = &(x->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  *ppSVar4 = x;
  SQObjectPtr::SQObjectPtr(&local_30,x);
  SQObjectPtr::operator=(target,&local_30);
LAB_00127b89:
  SQObjectPtr::~SQObjectPtr(&local_30);
  return;
}

Assistant:

void SQVM::FindOuter(SQObjectPtr &target, SQObjectPtr *stackindex)
{
    SQOuter **pp = &_openouters;
    SQOuter *p;
    SQOuter *otr;

    while ((p = *pp) != NULL && p->_valptr >= stackindex) {
        if (p->_valptr == stackindex) {
            target = SQObjectPtr(p);
            return;
        }
        pp = &p->_next;
    }
    otr = SQOuter::Create(_ss(this), stackindex);
    otr->_next = *pp;
    otr->_idx  = (stackindex - _stack._vals);
    __ObjAddRef(otr);
    *pp = otr;
    target = SQObjectPtr(otr);
}